

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeWebAssemblyModuleConstructor
               (DynamicObject *constructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  Var value;
  DynamicObject **ppDVar1;
  JavascriptString *value_00;
  JavascriptLibrary *library;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *constructor_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,constructor,mode,5,0);
  this = RecyclableObject::GetLibrary(&constructor->super_RecyclableObject);
  value = TaggedInt::ToVarUnchecked(1);
  AddMember(this,constructor,0xd1,value,'\x02');
  ppDVar1 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)&this->webAssemblyModulePrototype);
  AddMember(this,constructor,0x124,*ppDVar1,'\0');
  value_00 = CreateStringFromCppLiteral<7ul>(this,(char16 (*) [7])0x19955dc);
  AddMember(this,constructor,0x106,value_00,'\x02');
  AddFunctionToLibraryObject
            (this,constructor,0xe8,(FunctionInfo *)WebAssemblyModule::EntryInfo::Exports,1,'\x06');
  AddFunctionToLibraryObject
            (this,constructor,0xe9,(FunctionInfo *)WebAssemblyModule::EntryInfo::Imports,1,'\x06');
  AddFunctionToLibraryObject
            (this,constructor,0xea,(FunctionInfo *)WebAssemblyModule::EntryInfo::CustomSections,2,
             '\x06');
  DynamicObject::SetHasNoEnumerableProperties(constructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeWebAssemblyModuleConstructor(DynamicObject* constructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(constructor, mode, 5);
        JavascriptLibrary* library = constructor->GetLibrary();

        library->AddMember(constructor, PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable);
        library->AddMember(constructor, PropertyIds::prototype, library->webAssemblyModulePrototype, PropertyNone);
        library->AddMember(constructor, PropertyIds::name, library->CreateStringFromCppLiteral(_u("Module")), PropertyConfigurable);

        library->AddFunctionToLibraryObject(constructor, PropertyIds::exports, &WebAssemblyModule::EntryInfo::Exports, 1);
        library->AddFunctionToLibraryObject(constructor, PropertyIds::imports, &WebAssemblyModule::EntryInfo::Imports, 1);
        library->AddFunctionToLibraryObject(constructor, PropertyIds::customSections, &WebAssemblyModule::EntryInfo::CustomSections, 2);

        constructor->SetHasNoEnumerableProperties(true);

        return true;
    }